

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::ScopedTrace::PushTrace(ScopedTrace *this,char *file,int line,string *message)

{
  UnitTest *in_RSI;
  TraceInfo trace;
  TraceInfo *in_stack_ffffffffffffffa8;
  string local_40 [48];
  UnitTest *local_10;
  
  local_10 = in_RSI;
  internal::TraceInfo::TraceInfo((TraceInfo *)0x1d73d6);
  std::__cxx11::string::swap(local_40);
  UnitTest::GetInstance();
  UnitTest::PushGTestTrace(local_10,in_stack_ffffffffffffffa8);
  internal::TraceInfo::~TraceInfo((TraceInfo *)0x1d741e);
  return;
}

Assistant:

void ScopedTrace::PushTrace(const char* file, int line, std::string message) {
  internal::TraceInfo trace;
  trace.file = file;
  trace.line = line;
  trace.message.swap(message);

  UnitTest::GetInstance()->PushGTestTrace(trace);
}